

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDSharedSimd128.cpp
# Opt level: O0

void __thiscall
LowererMD::Simd128GenerateUpperBoundCheck
          (LowererMD *this,RegOpnd *indexOpnd,IndirOpnd *indirOpnd,ValueType arrType,Instr *instr)

{
  Lowerer *this_00;
  code *pcVar1;
  bool bVar2;
  IRType type;
  ValueType arrValueType;
  uint32 offset_00;
  int iVar3;
  int32 iVar4;
  JITTimeFunctionBody *this_01;
  undefined4 *puVar5;
  RegOpnd *pRVar6;
  ArrayRegOpnd *this_02;
  StackSym *pSVar7;
  LabelInstr *target;
  IntConstOpnd *pIVar8;
  int32 index;
  int32 offset;
  IntConstOpnd *elemCountOpnd;
  RegOpnd *tmp;
  int32 elemCount;
  LabelInstr *skipLabel;
  IndirOpnd *pIStack_40;
  int lengthOffset;
  Opnd *headSegmentLengthOpnd;
  ArrayRegOpnd *arrayRegOpnd;
  Instr *instr_local;
  IndirOpnd *indirOpnd_local;
  RegOpnd *indexOpnd_local;
  LowererMD *this_local;
  ValueType arrType_local;
  
  this_01 = Func::GetJITFunctionBody(this->m_func);
  bVar2 = JITTimeFunctionBody::IsAsmJsMode(this_01);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0xb48,"(!m_func->GetJITFunctionBody()->IsAsmJsMode())",
                       "!m_func->GetJITFunctionBody()->IsAsmJsMode()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pRVar6 = IR::IndirOpnd::GetBaseOpnd(indirOpnd);
  this_02 = IR::RegOpnd::AsArrayRegOpnd(pRVar6);
  bVar2 = IR::ArrayRegOpnd::EliminatedUpperBoundCheck(this_02);
  if (!bVar2) {
    pSVar7 = IR::ArrayRegOpnd::HeadSegmentLengthSym(this_02);
    if (pSVar7 == (StackSym *)0x0) {
      offset_00 = Lowerer::GetArrayOffsetOfLength(arrType);
      pIStack_40 = IR::IndirOpnd::New(&this_02->super_RegOpnd,offset_00,TyUint32,this->m_func,false)
      ;
    }
    else {
      pSVar7 = IR::ArrayRegOpnd::HeadSegmentLengthSym(this_02);
      pIStack_40 = (IndirOpnd *)IR::RegOpnd::New(pSVar7,TyUint32,this->m_func);
    }
    target = Lowerer::InsertLabel(false,instr);
    arrValueType = IR::Opnd::GetValueType((Opnd *)this_02);
    iVar3 = Lowerer::SimdGetElementCountFromBytes(arrValueType,instr->dataWidth);
    if (indexOpnd == (RegOpnd *)0x0) {
      iVar4 = IR::IndirOpnd::GetOffset(indirOpnd);
      this_00 = this->m_lowerer;
      pIVar8 = IR::IntConstOpnd::New((long)(iVar4 + iVar3),TyInt32,this->m_func,true);
      Lowerer::InsertCompareBranch
                (this_00,&pIStack_40->super_Opnd,&pIVar8->super_Opnd,BrLe_A,true,target,
                 &target->super_Instr,false);
    }
    else {
      type = IR::Opnd::GetType(&indexOpnd->super_Opnd);
      pRVar6 = IR::RegOpnd::New(type,this->m_func);
      pIVar8 = IR::IntConstOpnd::New((long)iVar3,TyInt8,this->m_func,true);
      Lowerer::InsertMove(&pRVar6->super_Opnd,&pIVar8->super_Opnd,&target->super_Instr,true);
      Lowerer::InsertAdd(false,&pRVar6->super_Opnd,&pRVar6->super_Opnd,&indexOpnd->super_Opnd,
                         &target->super_Instr);
      Lowerer::InsertCompareBranch
                (this->m_lowerer,&pRVar6->super_Opnd,&pIStack_40->super_Opnd,BrLe_A,true,target,
                 &target->super_Instr,false);
    }
    Lowerer::GenerateRuntimeError
              (this->m_lowerer,&target->super_Instr,-0x7ff5ebf6,HelperOp_RuntimeRangeError);
  }
  return;
}

Assistant:

void
LowererMD::Simd128GenerateUpperBoundCheck(IR::RegOpnd *indexOpnd, IR::IndirOpnd *indirOpnd, ValueType arrType, IR::Instr *instr)
{
    Assert(!m_func->GetJITFunctionBody()->IsAsmJsMode());

    IR::ArrayRegOpnd *arrayRegOpnd = indirOpnd->GetBaseOpnd()->AsArrayRegOpnd();
    IR::Opnd* headSegmentLengthOpnd;

    if (arrayRegOpnd->EliminatedUpperBoundCheck())
    {
        // already eliminated or extracted by globOpt (OptArraySrc). Nothing to do.
        return;
    }

    if (arrayRegOpnd->HeadSegmentLengthSym())
    {
        headSegmentLengthOpnd = IR::RegOpnd::New(arrayRegOpnd->HeadSegmentLengthSym(), TyUint32, m_func);
    }
    else
    {
        // (headSegmentLength = [base + offset(length)])
        int lengthOffset;
        lengthOffset = m_lowerer->GetArrayOffsetOfLength(arrType);
        headSegmentLengthOpnd = IR::IndirOpnd::New(arrayRegOpnd, lengthOffset, TyUint32, m_func);
    }

    IR::LabelInstr * skipLabel = Lowerer::InsertLabel(false, instr);
    int32 elemCount = Lowerer::SimdGetElementCountFromBytes(arrayRegOpnd->GetValueType(), instr->dataWidth);
    if (indexOpnd)
    {
        //  MOV tmp, elemCount
        //  ADD tmp, index
        //  CMP tmp, Length  -- upper bound check
        //  JBE  $storeLabel
        //  Throw RuntimeError
        //  skipLabel:
        IR::RegOpnd *tmp = IR::RegOpnd::New(indexOpnd->GetType(), m_func);
        IR::IntConstOpnd *elemCountOpnd = IR::IntConstOpnd::New(elemCount, TyInt8, m_func, true);
        m_lowerer->InsertMove(tmp, elemCountOpnd, skipLabel);
        Lowerer::InsertAdd(false, tmp, tmp, indexOpnd, skipLabel);
        m_lowerer->InsertCompareBranch(tmp, headSegmentLengthOpnd, Js::OpCode::BrLe_A, true, skipLabel, skipLabel);
    }
    else
    {
        // CMP Length, (offset + elemCount)
        // JA $storeLabel
        int32 offset = indirOpnd->GetOffset();
        int32 index = offset + elemCount;
        m_lowerer->InsertCompareBranch(headSegmentLengthOpnd, IR::IntConstOpnd::New(index, TyInt32, m_func, true), Js::OpCode::BrLe_A, true, skipLabel, skipLabel);
    }
    m_lowerer->GenerateRuntimeError(skipLabel, JSERR_ArgumentOutOfRange, IR::HelperOp_RuntimeRangeError);
    return;
}